

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O0

void __thiscall crnlib::Resampler::resample_y(Resampler *this,Sample *Pdst)

{
  Sample *Psrc_00;
  int *piVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  Contrib_List *pCVar5;
  Sample *local_48;
  Sample *Ptmp;
  Contrib_List *Pclist;
  Sample *Psrc;
  int j;
  int i;
  Sample *Pdst_local;
  Resampler *this_local;
  
  pCVar5 = this->m_Pclist_y + this->m_cur_dst_y;
  local_48 = Pdst;
  if ((this->m_delay_x_resample & 1U) != 0) {
    local_48 = this->m_Ptmp_buf;
  }
  for (Psrc._4_4_ = 0; Psrc._4_4_ < (int)(uint)pCVar5->n; Psrc._4_4_ = Psrc._4_4_ + 1) {
    for (Psrc._0_4_ = 0;
        ((int)Psrc < 0x4000 &&
        (this->m_Pscan_buf->scan_buf_y[(int)Psrc] != (uint)pCVar5->p[Psrc._4_4_].pixel));
        Psrc._0_4_ = (int)Psrc + 1) {
    }
    Psrc_00 = this->m_Pscan_buf->scan_buf_l[(int)Psrc];
    if (Psrc._4_4_ == 0) {
      scale_y_mov(this,local_48,Psrc_00,pCVar5->p->weight,this->m_intermediate_x);
    }
    else {
      scale_y_add(this,local_48,Psrc_00,pCVar5->p[Psrc._4_4_].weight,this->m_intermediate_x);
    }
    piVar1 = this->m_Psrc_y_count;
    iVar3 = resampler_range_check((uint)pCVar5->p[Psrc._4_4_].pixel,this->m_resample_src_y);
    iVar4 = piVar1[iVar3] + -1;
    piVar1[iVar3] = iVar4;
    if (iVar4 == 0) {
      puVar2 = this->m_Psrc_y_flag;
      iVar3 = resampler_range_check((uint)pCVar5->p[Psrc._4_4_].pixel,this->m_resample_src_y);
      puVar2[iVar3] = '\0';
      this->m_Pscan_buf->scan_buf_y[(int)Psrc] = -1;
    }
  }
  if ((this->m_delay_x_resample & 1U) != 0) {
    resample_x(this,Pdst,local_48);
  }
  if (this->m_lo < this->m_hi) {
    clamp(this,Pdst,this->m_resample_dst_x);
  }
  return;
}

Assistant:

void Resampler::resample_y(Sample* Pdst)
    {
        int i, j;
        Sample* Psrc;
        Contrib_List* Pclist = &m_Pclist_y[m_cur_dst_y];

        Sample* Ptmp = m_delay_x_resample ? m_Ptmp_buf : Pdst;
        resampler_assert(Ptmp);

        /* Process each contributor. */

        for (i = 0; i < Pclist->n; i++)
        {
            /* locate the contributor's location in the scan
         * buffer -- the contributor must always be found!
         */

            for (j = 0; j < MAX_SCAN_BUF_SIZE; j++)
            {
                if (m_Pscan_buf->scan_buf_y[j] == Pclist->p[i].pixel)
                {
                    break;
                }
            }

            resampler_assert(j < MAX_SCAN_BUF_SIZE);

            Psrc = m_Pscan_buf->scan_buf_l[j];

            if (!i)
            {
                scale_y_mov(Ptmp, Psrc, Pclist->p[i].weight, m_intermediate_x);
            }
            else
            {
                scale_y_add(Ptmp, Psrc, Pclist->p[i].weight, m_intermediate_x);
            }

            /* If this source line doesn't contribute to any
         * more destination lines then mark the scanline buffer slot
         * which holds this source line as free.
         * (The max. number of slots used depends on the Y
         * axis sampling factor and the scaled filter width.)
         */

            if (--m_Psrc_y_count[resampler_range_check(Pclist->p[i].pixel, m_resample_src_y)] == 0)
            {
                m_Psrc_y_flag[resampler_range_check(Pclist->p[i].pixel, m_resample_src_y)] = FALSE;
                m_Pscan_buf->scan_buf_y[j] = -1;
            }
        }

        /* Now generate the destination line */

        if (m_delay_x_resample) // Was X resampling delayed until after Y resampling?
        {
            resampler_assert(Pdst != Ptmp);
            resample_x(Pdst, Ptmp);
        }
        else
        {
            resampler_assert(Pdst == Ptmp);
        }

        if (m_lo < m_hi)
        {
            clamp(Pdst, m_resample_dst_x);
        }
    }